

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtActivatingCollisionAlgorithm.cpp
# Opt level: O1

void __thiscall
cbtActivatingCollisionAlgorithm::cbtActivatingCollisionAlgorithm
          (cbtActivatingCollisionAlgorithm *this,cbtCollisionAlgorithmConstructionInfo *ci,
          cbtCollisionObjectWrapper *param_2,cbtCollisionObjectWrapper *param_3)

{
  cbtCollisionAlgorithm::cbtCollisionAlgorithm(&this->super_cbtCollisionAlgorithm,ci);
  (this->super_cbtCollisionAlgorithm)._vptr_cbtCollisionAlgorithm =
       (_func_int **)&PTR__cbtActivatingCollisionAlgorithm_00b70c80;
  return;
}

Assistant:

cbtActivatingCollisionAlgorithm::cbtActivatingCollisionAlgorithm(const cbtCollisionAlgorithmConstructionInfo& ci, const cbtCollisionObjectWrapper*, const cbtCollisionObjectWrapper*)
	: cbtCollisionAlgorithm(ci)
//,
//m_colObj0(0),
//m_colObj1(0)
{
	//	if (ci.m_dispatcher1->needsCollision(colObj0,colObj1))
	//	{
	//		m_colObj0 = colObj0;
	//		m_colObj1 = colObj1;
	//
	//		m_colObj0->activate();
	//		m_colObj1->activate();
	//	}
}